

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hpp
# Opt level: O3

void __thiscall
primecount::Vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
          (Vector<unsigned_long,_std::allocator<unsigned_long>_> *this,size_t n)

{
  unsigned_long *puVar1;
  ulong uVar2;
  
  puVar1 = this->array_;
  uVar2 = (long)this->end_ - (long)puVar1 >> 3;
  if (uVar2 < n) {
    if ((ulong)((long)this->capacity_ - (long)puVar1 >> 3) < n) {
      reserve_unchecked(this,n);
      puVar1 = this->array_;
    }
  }
  else if (uVar2 <= n) {
    return;
  }
  this->end_ = puVar1 + n;
  return;
}

Assistant:

void resize(std::size_t n)
  {
    if (n > size())
    {
      if (n > capacity())
        reserve_unchecked(n);

      // This default initializes memory of classes and structs
      // with constructors (and with in-class initialization of
      // non-static members). But it does not default initialize
      // memory for POD types like int, long.
      if (!std::is_trivial<T>::value)
        uninitialized_default_construct(end_, array_ + n);

      end_ = array_ + n;
    }
    else if (n < size())
    {
      destroy(array_ + n, end_);
      end_ = array_ + n;
    }
  }